

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O1

string * __thiscall
LinearSystem::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,LinearSystem *this)

{
  pointer pOVar1;
  char cVar2;
  string *psVar3;
  int iVar4;
  ostream *poVar5;
  Matrix *this_00;
  int iVar6;
  Operation *operation;
  pointer pOVar7;
  SwapMatrix swaps;
  ostringstream out;
  LinearSystem current_system;
  SwapMatrix local_318;
  LinearSystem *local_2f8;
  string *local_2f0;
  ExtendedMatrix *local_2e8;
  long local_2e0 [14];
  ios_base local_270 [264];
  LinearSystem local_168;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e0);
  local_2f8 = this;
  LinearSystem(&local_168,&this->start_system_,this->mode_);
  local_2f0 = __return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\[",2);
  std::ios::widen((char)(ostream *)local_2e0 + (char)*(undefined8 *)(local_2e0[0] + -0x18));
  std::ostream::put((char)local_2e0);
  std::ostream::flush();
  poVar5 = operator<<((ostream *)local_2e0,&local_168.system_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_318.first_row_ = 0;
  local_318.second_row_ = 0;
  local_318.first_main_column_ = 0;
  local_318.second_main_column_ = 0;
  local_318.first_extension_column_ = 0;
  local_318.second_extension_column_ = 0;
  pOVar7 = (local_2f8->history_).
           super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (local_2f8->history_).
           super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar7 != pOVar1) {
    local_2e8 = &local_2f8->system_;
    iVar6 = 1;
    do {
      ApplyOperation(&local_168,pOVar7->operation_type,pOVar7->lhs,pOVar7->rhs,pOVar7->coefficient);
      if (pOVar7->operation_type == SwapColumns) {
        local_318.second_main_column_ = pOVar7->rhs + 1;
        local_318.first_main_column_ = pOVar7->lhs + 1;
      }
      else if (pOVar7->operation_type == SwapRows) {
        local_318.second_row_ = pOVar7->rhs + 1;
        local_318.first_row_ = pOVar7->lhs + 1;
        if (local_2f8->mode_ == LU) {
          this_00 = ExtendedMatrix::GetMainMatrix(local_2e8);
          iVar4 = Matrix::GetNumColumns(this_00);
          local_318.second_extension_column_ = iVar4 + 1 + pOVar7->rhs;
          local_318.first_extension_column_ = pOVar7->lhs + iVar4 + 1;
        }
      }
      if ((Options::step_by_step_type == 2) ||
         ((Options::step_by_step_type == 1 && (pOVar7->operation_type == MainOutput)))) {
        if (iVar6 == Options::max_matrices_count_in_row) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\sim",4);
          cVar2 = (char)(ostream *)local_2e0;
          std::ios::widen((char)*(undefined8 *)(local_2e0[0] + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\]",2);
          std::ios::widen((char)*(undefined8 *)(local_2e0[0] + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\[",2);
          std::ios::widen((char)*(undefined8 *)(local_2e0[0] + -0x18) + cVar2);
          std::ostream::put(cVar2);
          iVar6 = 0;
          std::ostream::flush();
        }
        if (((local_318.first_row_ != local_318.second_row_) ||
            (local_318.first_main_column_ != local_318.second_main_column_)) ||
           (local_318.first_extension_column_ != local_318.second_extension_column_)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\sim",4);
          operator<<((ostream *)local_2e0,&local_318);
          local_318.first_row_ = 0;
          local_318.second_row_ = 0;
          local_318.first_main_column_ = 0;
          local_318.second_main_column_ = 0;
          local_318.first_extension_column_ = 0;
          local_318.second_extension_column_ = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\sim",4);
        poVar5 = operator<<((ostream *)local_2e0,&local_168.system_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        iVar6 = iVar6 + 1;
      }
      pOVar7 = pOVar7 + 1;
    } while (pOVar7 != pOVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e0,"\\]",2);
  psVar3 = local_2f0;
  std::__cxx11::stringbuf::str();
  ~LinearSystem(&local_168);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e0);
  std::ios_base::~ios_base(local_270);
  return psVar3;
}

Assistant:

std::string LinearSystem::ToLaTex() const {
  std::ostringstream out;
  LinearSystem current_system(start_system_, mode_);

  out << "\\[" << std::endl;
  out << current_system.system_ << std::endl;

  SwapMatrix swaps;
  int matrices_count_in_row = 1;
  for (const auto& operation : history_) {
    current_system.ApplyOperation(operation);

    if (operation.operation_type == OperationType::SwapRows) {
      swaps.SetRowSwap(operation.lhs, operation.rhs);
      if (mode_ == Mode::LU) {
        int m = system_.GetMainMatrix().GetNumColumns();
        swaps.SetExtensionColumnSwap(operation.lhs + m, operation.rhs + m);
      }
    } else if (operation.operation_type == OperationType::SwapColumns) {
      swaps.SetMainColumnSwap(operation.lhs, operation.rhs);
    }

    if (Options::step_by_step_type != Options::StepByStepType::AllSteps &&
        (Options::step_by_step_type != Options::StepByStepType::MainSteps ||
         operation.operation_type != OperationType::MainOutput)) {
      continue;
    }

    if (matrices_count_in_row == Options::max_matrices_count_in_row) {
      out << "\\sim" << std::endl;
      out << "\\]" << std::endl;
      out << "\\[" << std::endl;
      matrices_count_in_row = 0;
    }

    if (!swaps.IsEmpty()) {
      out << "\\sim" << swaps;
      swaps.Clear();
    }

    out << "\\sim" << current_system.system_ << std::endl;
    ++matrices_count_in_row;
  }

  out << "\\]";

  return out.str();
}